

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int recv_message(void)

{
  sockaddr_in addr_00;
  sockaddr_in addr_from;
  sockaddr_in addr_from_00;
  sockaddr_in addr_from_01;
  sockaddr_in addr_01;
  int iVar1;
  uint32_t uVar2;
  Ip_Port IVar3;
  size_type sVar4;
  mapped_type *pmVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  size_type sVar8;
  rep rVar9;
  mapped_type_conflict *pmVar10;
  int res;
  duration<long,_std::ratio<1L,_1000000L>_> local_78;
  rep local_70;
  longlong ll_cur_time;
  duration<long,_std::ratio<1L,_1000000000L>_> local_60;
  duration cur_time;
  int id_message;
  int type;
  int current_id;
  sockaddr_in sStack_40;
  key_type local_30;
  Ip_Port ip_port;
  ssize_t size;
  socklen_t addr_size;
  sockaddr_in addr;
  
  size._0_4_ = 0x10;
  ip_port = (Ip_Port)recvfrom(socket_fd,buf,1000000,0,(sockaddr *)((long)&size + 4),
                              (socklen_t *)&size);
  iVar1 = rand();
  if (iVar1 % 99 + 1 < precent_lose) {
    fprintf(_stderr,"Bwahaha you just lose new message: %d\n",(ulong)(uint)precent_lose);
    addr.sin_zero[0] = '\0';
    addr.sin_zero[1] = '\0';
    addr.sin_zero[2] = '\0';
    addr.sin_zero[3] = '\0';
  }
  else {
    _type = stack0xffffffffffffffe4;
    sStack_40.sin_family = addr.sin_family;
    sStack_40.sin_port = addr.sin_port;
    sStack_40.sin_addr.s_addr = addr.sin_addr.s_addr;
    addr_01.sin_zero = (uchar  [8])addr._0_8_;
    addr_01.sin_family = size._4_2_;
    addr_01.sin_port = size._6_2_;
    addr_01.sin_addr.s_addr = addr_size;
    IVar3 = get_ip_port(addr_01);
    local_30.first = IVar3.first;
    local_30.second = IVar3.second;
    sVar4 = std::
            map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
            ::count(&idconnections,&local_30);
    iVar1 = global_map_id;
    if (sVar4 == 0) {
      pmVar5 = std::
               map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
               ::operator[](&idconnections,&local_30);
      *pmVar5 = iVar1;
      pmVar6 = std::
               map<int,_sockaddr_in,_std::less<int>,_std::allocator<std::pair<const_int,_sockaddr_in>_>_>
               ::operator[](&connections,&global_map_id);
      pmVar6->sin_family = size._4_2_;
      pmVar6->sin_port = size._6_2_;
      pmVar6->sin_addr = (in_addr)addr_size;
      *(undefined8 *)pmVar6->sin_zero = addr._0_8_;
      id_message = global_map_id;
      global_map_id = global_map_id + 1;
    }
    else {
      pmVar5 = std::
               map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
               ::operator[](&idconnections,&local_30);
      id_message = *pmVar5;
    }
    if ((long)ip_port < 4) {
      fprintf(_stderr,"Bad message size\n");
      addr.sin_zero[0] = 0xff;
      addr.sin_zero[1] = 0xff;
      addr.sin_zero[2] = 0xff;
      addr.sin_zero[3] = 0xff;
    }
    else {
      uVar2 = ntohl(*buf);
      cur_time.__r._4_4_ = ntohl(*(uint32_t *)((long)buf + 4));
      fprintf(_stderr,"Type message: %d\n",(ulong)uVar2);
      pmVar7 = std::
               map<int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>_>
               ::operator[](&received_messages,&id_message);
      sVar8 = std::
              map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
              ::count(pmVar7,(key_type *)((long)&cur_time.__r + 4));
      if (sVar8 == 0) {
        ll_cur_time = std::chrono::_V2::system_clock::now();
        local_60.__r = (rep)std::chrono::
                            time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                                *)&ll_cur_time);
        local_78.__r = (rep)std::chrono::
                            duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
                                      (&local_60);
        rVar9 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count(&local_78);
        local_70 = rVar9;
        pmVar7 = std::
                 map<int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>_>_>_>
                 ::operator[](&received_messages,&id_message);
        pmVar10 = std::
                  map<int,_long_long,_std::less<int>,_std::allocator<std::pair<const_int,_long_long>_>_>
                  ::operator[](pmVar7,(key_type *)((long)&cur_time.__r + 4));
        *pmVar10 = rVar9;
        if (uVar2 == 0) {
          delete_delivered_message(id_message,cur_time.__r._4_4_);
          addr.sin_zero[0] = '\x01';
          addr.sin_zero[1] = '\0';
          addr.sin_zero[2] = '\0';
          addr.sin_zero[3] = '\0';
        }
        else {
          if (uVar2 == 5) {
            addr_from_01.sin_zero = (uchar  [8])addr._0_8_;
            addr_from_01.sin_family = size._4_2_;
            addr_from_01.sin_port = size._6_2_;
            addr_from_01.sin_addr.s_addr = addr_size;
            handle_child_message(addr_from_01);
            send_good_message(id_message,cur_time.__r._4_4_);
          }
          else if (uVar2 == 3) {
            addr_from_00.sin_zero = (uchar  [8])addr._0_8_;
            addr_from_00.sin_family = size._4_2_;
            addr_from_00.sin_port = size._6_2_;
            addr_from_00.sin_addr.s_addr = addr_size;
            handle_parent_message(addr_from_00);
            send_good_message(id_message,cur_time.__r._4_4_);
          }
          else if (uVar2 == 4) {
            flag_root = true;
            fprintf(_stderr,"!!! I am a root now\n");
            send_good_message(id_message,cur_time.__r._4_4_);
          }
          else if (uVar2 == 2) {
            addr_from.sin_zero = (uchar  [8])addr._0_8_;
            addr_from.sin_family = size._4_2_;
            addr_from.sin_port = size._6_2_;
            addr_from.sin_addr.s_addr = addr_size;
            handle_left(addr_from);
            send_good_message(id_message,cur_time.__r._4_4_);
          }
          else if ((uVar2 == 1) &&
                  (addr_00.sin_zero = (uchar  [8])addr._0_8_, addr_00.sin_family = size._4_2_,
                  addr_00.sin_port = size._6_2_, addr_00.sin_addr.s_addr = addr_size,
                  iVar1 = handle_message(addr_00,id_message), iVar1 == 1)) {
            send_good_message(id_message,cur_time.__r._4_4_);
          }
          addr.sin_zero[0] = '\x01';
          addr.sin_zero[1] = '\0';
          addr.sin_zero[2] = '\0';
          addr.sin_zero[3] = '\0';
        }
      }
      else {
        addr.sin_zero[0] = '\0';
        addr.sin_zero[1] = '\0';
        addr.sin_zero[2] = '\0';
        addr.sin_zero[3] = '\0';
      }
    }
  }
  iVar1._0_1_ = addr.sin_zero[0];
  iVar1._1_1_ = addr.sin_zero[1];
  iVar1._2_1_ = addr.sin_zero[2];
  iVar1._3_1_ = addr.sin_zero[3];
  return iVar1;
}

Assistant:

int recv_message() {
    struct sockaddr_in addr;
    socklen_t addr_size = sizeof(struct sockaddr_in);
    ssize_t size = recvfrom(socket_fd, buf, BUFFER_SIZE, 0, (struct sockaddr *) &addr, &addr_size);

    if (rand() % 99 + 1 < precent_lose) {
        fprintf(stderr, "Bwahaha you just lose new message: %d\n", precent_lose);
        return 0;
    }

    Ip_Port ip_port = get_ip_port(addr);
    int current_id;
    if (!idconnections.count(ip_port)) {
        idconnections[ip_port] = global_map_id;
        connections[global_map_id] = addr;
        current_id = global_map_id;
        ++global_map_id;
    }
    else {
        current_id = idconnections[ip_port];
    }

    if (size < 4) {
        fprintf(stderr, "Bad message size\n");
        return -1;
    }

    int type = (int)ntohl(((uint32_t*)buf)[0]);
    int id_message = (int)ntohl(((uint32_t*)buf)[1]);
    fprintf(stderr, "Type message: %d\n", type);

    if (received_messages[current_id].count(id_message)) {
        return 0;
    }
    else {
        auto cur_time = std::chrono::high_resolution_clock::now().time_since_epoch();
        long long ll_cur_time = std::chrono::duration_cast<std::chrono::microseconds>(cur_time).count();
        received_messages[current_id][id_message] = ll_cur_time;
    }

    if (GOODMSG == type) {
        delete_delivered_message(current_id, id_message);
        return 1;
    }

    if (CHILD == type) {
        handle_child_message(addr);
        send_good_message(current_id, id_message);
    }
    else if (PARENT == type) {
        handle_parent_message(addr);
        send_good_message(current_id, id_message);
    }
    else if (ROOT == type) {
        flag_root = true;
        fprintf(stderr, "!!! I am a root now\n");
        send_good_message(current_id, id_message);
    }
    else if (LEFT == type) {
        handle_left(addr);
        send_good_message(current_id, id_message);
    }
    else if (MSG == type) {
        int res = handle_message(addr, current_id);
        if (1 == res) {
            send_good_message(current_id, id_message);
        }
    }

    return 1;
}